

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown4_SSSE3(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  char cVar3;
  short sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [15];
  uint3 uVar14;
  undefined1 auVar15 [11];
  int iVar16;
  ushort uVar17;
  undefined1 auVar18 [12];
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  undefined1 auVar20 [16];
  ushort uVar27;
  undefined1 auVar28 [16];
  byte bVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined1 auVar19 [14];
  
  do {
    auVar20 = *(undefined1 (*) [16])src_ptr;
    pauVar1 = (undefined1 (*) [16])((long)src_ptr + 0x10);
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    auVar12[10] = 0xff;
    auVar12._0_10_ = (unkuint10)0xff000000ff0000;
    auVar12._11_3_ = 0;
    auVar12[0xe] = 0xff;
    auVar12[0xf] = 0;
    auVar20 = auVar20 & auVar12;
    auVar28[10] = 0xff;
    auVar28._0_10_ = (unkuint10)0xff000000ff0000;
    auVar28._11_3_ = 0;
    auVar28[0xe] = 0xff;
    auVar28[0xf] = 0;
    auVar28 = *pauVar1 & auVar28;
    uVar17 = auVar20._2_2_;
    cVar3 = (uVar17 != 0) * (uVar17 < 0x100) * auVar20[2] - (0xff < uVar17);
    auVar13._1_14_ = auVar20._2_14_;
    auVar13[0] = cVar3;
    uVar17 = auVar20._6_2_;
    bVar4 = (uVar17 != 0) * (uVar17 < 0x100) * auVar20[6] - (0xff < uVar17);
    sVar11 = auVar20._10_2_;
    bVar5 = (0 < sVar11) * (sVar11 < 0x100) * auVar20[10] - (0xff < sVar11);
    sVar11 = auVar20._14_2_;
    bVar6 = (0 < sVar11) * (sVar11 < 0x100) * auVar20[0xe] - (0xff < sVar11);
    uVar17 = auVar28._2_2_;
    cVar7 = (uVar17 != 0) * (uVar17 < 0x100) * auVar28[2] - (0xff < uVar17);
    uVar14 = CONCAT12(cVar7,(ushort)bVar6);
    auVar15._3_8_ = 0;
    auVar15._0_3_ = uVar14;
    auVar18._0_11_ = auVar15 << 0x38;
    uVar17 = auVar28._6_2_;
    cVar8 = (uVar17 != 0) * (uVar17 < 0x100) * auVar28[6] - (0xff < uVar17);
    auVar18[0xb] = cVar8;
    sVar11 = auVar28._8_2_;
    auVar19[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar28[8] - (0xff < sVar11);
    auVar19._0_12_ = auVar18;
    sVar11 = auVar28._10_2_;
    cVar9 = (0 < sVar11) * (sVar11 < 0x100) * auVar28[10] - (0xff < sVar11);
    auVar19[0xd] = cVar9;
    sVar11 = auVar28._12_2_;
    auVar20[0xe] = (0 < sVar11) * (sVar11 < 0x100) * auVar28[0xc] - (0xff < sVar11);
    auVar20._0_14_ = auVar19;
    sVar11 = auVar28._14_2_;
    cVar10 = (0 < sVar11) * (sVar11 < 0x100) * auVar28[0xe] - (0xff < sVar11);
    auVar20[0xf] = cVar10;
    uVar17 = auVar13._0_2_ & 0xff;
    uVar21 = (ushort)(((uint)bVar4 << 0x18) >> 0x18);
    uVar22 = (ushort)(((uint6)bVar5 << 0x28) >> 0x28);
    uVar23 = (ushort)(((ulong)bVar6 << 0x38) >> 0x38);
    uVar24 = (ushort)(uVar14 >> 0x10);
    uVar25 = auVar18._10_2_ >> 8;
    uVar26 = auVar19._12_2_ >> 8;
    uVar27 = auVar20._14_2_ >> 8;
    *(ulong *)dst_ptr =
         CONCAT17((uVar27 != 0) * (uVar27 < 0x100) * cVar10 - (0xff < uVar27),
                  CONCAT16((uVar26 != 0) * (uVar26 < 0x100) * cVar9 - (0xff < uVar26),
                           CONCAT15((uVar25 != 0) * (uVar25 < 0x100) * cVar8 - (0xff < uVar25),
                                    CONCAT14((uVar24 != 0) * (uVar24 < 0x100) * cVar7 -
                                             (0xff < uVar24),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) * bVar6 -
                                                      (0xff < uVar23),
                                                      CONCAT12((uVar22 != 0) * (uVar22 < 0x100) *
                                                               bVar5 - (0xff < uVar22),
                                                               CONCAT11((uVar21 != 0) *
                                                                        (uVar21 < 0x100) * bVar4 -
                                                                        (0xff < uVar21),
                                                                        (cVar3 != '\0') *
                                                                        (uVar17 < 0x100) * cVar3 -
                                                                        (0xff < uVar17))))))));
    dst_ptr = dst_ptr + 8;
    iVar16 = dst_width + -8;
    bVar2 = 7 < dst_width;
    dst_width = iVar16;
  } while (iVar16 != 0 && bVar2);
  return;
}

Assistant:

void ScaleRowDown4_SSSE3(const uint8_t* src_ptr,
                         ptrdiff_t src_stride,
                         uint8_t* dst_ptr,
                         int dst_width) {
  (void)src_stride;
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psrld       $0x18,%%xmm5                  \n"
      "pslld       $0x10,%%xmm5                  \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "pand        %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "psrlw       $0x8,%%xmm0                   \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm5");
}